

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O3

bool __thiscall
HighsCutGeneration::tryGenerateCut
          (HighsCutGeneration *this,vector<int,_std::allocator<int>_> *inds_,
          vector<double,_std::allocator<double>_> *vals_,bool hasUnboundedInts,bool hasGeneralInts,
          bool hasContinuous,double minEfficacy,bool onlyInitialCMIRScale,bool allowRejectCut,
          bool lpSol)

{
  HighsCDouble *pHVar1;
  double dVar2;
  double dVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer puVar6;
  double dVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  pointer pdVar11;
  pointer puVar12;
  pointer puVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined7 in_register_00000009;
  long lVar17;
  bool bVar18;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 uVar19;
  double dVar20;
  HighsCDouble tmpRhs;
  HighsCDouble __tmp;
  pointer local_f8;
  pointer piStack_f0;
  pointer piStack_e8;
  vector<double,_std::allocator<double>_> *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  pointer local_b8;
  pointer pdStack_b0;
  pointer pdStack_a8;
  undefined1 local_98 [16];
  double local_88;
  double dStack_80;
  vector<double,_std::allocator<double>_> local_70;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  double dStack_40;
  
  if ((int)CONCAT71(in_register_00000009,hasUnboundedInts) != 0) {
    bVar15 = cmirCutGenerationHeuristic(this,minEfficacy,onlyInitialCMIRScale);
    return bVar15;
  }
  local_98._8_4_ = in_XMM0_Dc;
  local_98._0_8_ = minEfficacy;
  local_98._12_4_ = in_XMM0_Dd;
  local_e0 = vals_;
  std::vector<double,std::allocator<double>>::vector<double*,void>
            ((vector<double,std::allocator<double>> *)&local_b8,this->vals,this->vals + this->rowlen
             ,(allocator_type *)&local_f8);
  std::vector<int,std::allocator<int>>::vector<int*,void>
            ((vector<int,std::allocator<int>> *)&local_f8,this->inds,this->inds + this->rowlen,
             (allocator_type *)&local_d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_d8,&this->complementation);
  std::vector<double,_std::allocator<double>_>::vector(&local_70,&this->solval);
  local_88 = (this->rhs).hi;
  dStack_80 = (this->rhs).lo;
  bVar15 = determineCover(this,lpSol);
  pHVar1 = &this->rhs;
  if (bVar15) {
    if (hasContinuous || hasGeneralInts) {
      if (hasGeneralInts) {
        bVar15 = separateLiftedMixedIntegerCover(this);
      }
      else {
        bVar15 = separateLiftedMixedBinaryCover(this);
      }
      if (bVar15 == false) goto LAB_002804d1;
    }
    else {
      separateLiftedKnapsackCover(this);
    }
    dVar20 = -((this->rhs).hi + (this->rhs).lo);
    if ((long)this->rowlen < 1) {
      dVar7 = 0.0;
    }
    else {
      lVar17 = 0;
      dVar7 = 0.0;
      do {
        dVar2 = this->vals[lVar17];
        dVar3 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar17];
        if (((dVar2 <= 0.0) || (this->feastol < dVar3)) &&
           ((0.0 <= dVar2 ||
            (dVar3 < (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar17] - this->feastol)))) {
          dVar7 = dVar7 + dVar2 * dVar2;
        }
        dVar20 = dVar20 + dVar2 * dVar3;
        lVar17 = lVar17 + 1;
      } while (this->rowlen != lVar17);
    }
    bVar15 = this->integralSupport;
    bVar18 = this->integralCoefficients;
    if (dVar7 < 0.0) {
      uStack_50 = 0x8000000000000000;
      local_58 = dVar20;
      dVar7 = sqrt(dVar7);
      dVar20 = local_58;
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    if ((!allowRejectCut) || ((double)local_98._0_8_ < dVar20 / dVar7)) {
      uVar19 = local_98._12_4_;
      local_98._8_4_ = local_98._8_4_;
      local_98._0_8_ = (double)local_98._0_8_ + dVar20 / dVar7;
      local_98._12_4_ = uVar19;
      local_48 = local_88;
      dStack_40 = dStack_80;
      dVar20 = pHVar1->hi;
      dVar7 = (this->rhs).lo;
      pHVar1->hi = local_88;
      (this->rhs).lo = dStack_80;
      bVar14 = true;
      local_88 = dVar20;
      dStack_80 = dVar7;
    }
    else {
      pHVar1->hi = local_88;
      (this->rhs).lo = dStack_80;
      bVar14 = false;
    }
  }
  else {
LAB_002804d1:
    bVar14 = false;
    bVar15 = false;
    bVar18 = false;
  }
  this->inds = local_f8;
  this->vals = local_b8;
  bVar16 = cmirCutGenerationHeuristic(this,(double)local_98._0_8_,onlyInitialCMIRScale);
  if (bVar16) {
    piVar4 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
    piVar8 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar9 = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
         = local_f8;
    (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piStack_f0;
    (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piStack_e8;
    pdVar5 = (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar10 = (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pdVar11 = (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_b8;
    (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pdStack_b0;
    (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdStack_a8;
    this->inds = local_f8;
    this->vals = local_b8;
    bVar15 = true;
    local_f8 = piVar8;
    piStack_f0 = piVar9;
    piStack_e8 = piVar4;
    local_b8 = pdVar10;
    pdStack_b0 = pdVar11;
    pdStack_a8 = pdVar5;
  }
  else if (bVar14) {
    pHVar1->hi = local_88;
    (this->rhs).lo = dStack_80;
    puVar6 = (this->complementation).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    puVar12 = (this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar13 = (this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    pdVar5 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    pdVar10 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pdVar11 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    this->inds = (inds_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    this->vals = (local_e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    this->integralSupport = bVar15;
    this->integralCoefficients = bVar18;
    bVar15 = true;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = puVar12;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar13;
    local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar6;
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = pdVar5;
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = pdVar10;
    local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pdVar11;
  }
  else {
    bVar15 = false;
  }
  if (local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8 != (pointer)0x0) {
    operator_delete(local_f8);
  }
  if (local_b8 != (pointer)0x0) {
    operator_delete(local_b8);
  }
  return bVar15;
}

Assistant:

bool HighsCutGeneration::tryGenerateCut(std::vector<HighsInt>& inds_,
                                        std::vector<double>& vals_,
                                        bool hasUnboundedInts,
                                        bool hasGeneralInts, bool hasContinuous,
                                        double minEfficacy,
                                        bool onlyInitialCMIRScale,
                                        bool allowRejectCut, bool lpSol) {
  // use cmir if there are unbounded integer variables
  if (hasUnboundedInts)
    return cmirCutGenerationHeuristic(minEfficacy, onlyInitialCMIRScale);

  // 0. Save data before determining cover and applying lifting functions
  std::vector<double> tmpVals(vals, vals + rowlen);
  std::vector<HighsInt> tmpInds(inds, inds + rowlen);
  std::vector<uint8_t> tmpComplementation(complementation);
  std::vector<double> tmpSolval(solval);
  HighsCDouble tmpRhs = rhs;

  // 1. Determine a cover, cover does not need to be minimal as neither of
  //    the lifting functions have minimality of the cover as necessary facet
  //    condition
  bool success = false;
  bool saveIntegalSupport = false;
  bool saveIntegralCoefficients = false;
  do {
    if (!determineCover(lpSol)) break;

    // 2. use superadditive lifting function depending on structure of base
    //    inequality:
    //    We have 3 lifting functions available for pure binary knapsack sets,
    //    for mixed-binary knapsack sets and for mixed integer knapsack sets.
    if (!hasContinuous && !hasGeneralInts) {
      separateLiftedKnapsackCover();
      success = true;
    } else if (hasGeneralInts) {
      success = separateLiftedMixedIntegerCover();
    } else {
      assert(hasContinuous);
      assert(!hasGeneralInts);
      success = separateLiftedMixedBinaryCover();
    }
  } while (false);

  double minMirEfficacy = minEfficacy;
  if (success) {
    // save data that might otherwise be overwritten when calling the cmir
    // separator
    saveIntegalSupport = integralSupport;
    saveIntegralCoefficients = integralCoefficients;

    // compute violation and squared norm
    double violation = -double(rhs);
    double sqrnorm = 0.0;
    for (HighsInt i = 0; i < rowlen; ++i) {
      updateViolationAndNorm(i, vals[i], violation, sqrnorm);
    }

    // compute efficacy (distance cut off)
    double efficacy = violation / std::sqrt(sqrnorm);
    if (allowRejectCut && efficacy <= minEfficacy) {
      // reject cut
      success = false;
      rhs = tmpRhs;
    } else {
      // accept cut and increase minimum efficiency requirement for cmir cut
      minMirEfficacy += efficacy;
      std::swap(tmpRhs, rhs);
    }
  }

  // restore indices and values; lifting methods do not modify complementation
  // and, thus, complementation-related data does not have to be restored here.
  inds = tmpInds.data();
  vals = tmpVals.data();

  if (cmirCutGenerationHeuristic(minMirEfficacy, onlyInitialCMIRScale)) {
    // take the cmir cut as it is better
    inds_.swap(tmpInds);
    vals_.swap(tmpVals);
    inds = inds_.data();
    vals = vals_.data();
    return true;
  } else if (success) {
    // take the previous lifted cut as cmir could not improve
    // we restore the old complementation vector, right hand side, and values
    rhs = tmpRhs;
    // note that the solution vector solval also needs to be restored because it
    // depends on the complementation. it would be OK not to restore solval, if
    // there would be a guarantee that it is not used from here on.
    complementation.swap(tmpComplementation);
    solval.swap(tmpSolval);
    inds = inds_.data();
    vals = vals_.data();
    // restore indicators
    integralSupport = saveIntegalSupport;
    integralCoefficients = saveIntegralCoefficients;
    return true;
  } else
    // neither cmir nor lifted cut successful
    return false;
}